

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O2

int libj1939_create_epoll(void)

{
  FILE *__stream;
  uint __errnum;
  int *piVar1;
  char *pcVar2;
  
  __errnum = epoll_create1(0);
  if ((int)__errnum < 0) {
    piVar1 = __errno_location();
    __stream = _stderr;
    __errnum = -*piVar1;
    pcVar2 = strerror(__errnum);
    fprintf(__stream,"epoll_create1: %d (%s)",(ulong)__errnum,pcVar2);
  }
  return __errnum;
}

Assistant:

int libj1939_create_epoll(void)
{
	int ret, epoll_fd;

	epoll_fd = epoll_create1(0);
	if (epoll_fd < 0) {
		ret = -errno;
		pr_err("epoll_create1: %d (%s)", ret, strerror(ret));
		return ret;
	}

	return epoll_fd;
}